

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

string * __thiscall
Token::get_typename_abi_cxx11_(string *__return_storage_ptr__,Token *this,int type)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  undefined4 local_14;
  string *psStack_10;
  int type_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_14) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15a6d,&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15a83,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15a8d,&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15aa3,&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15ab9,&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15acf,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15ae5,&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15afb,&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,anon_var_dwarf_15b05,&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::get_typename(int type) {
    switch (type) {
        case KEY_WORD:
            return "(关键字)keyword";
        case OPERATOR:
            return "(操作符)operator";
        case DELIMITERS:
            return "(分隔符)delimiter";
        case IDENTIFIER:
            return "(标识符)id";
        case NUMBER:
            return "(数字)  number";
        case STRING:
            return "(字符串)string";
        case CHAR:
            return "(字符)  char";
        case ANNOTATION:
            return "(注解)  annotation";
        default:
            return "(未知)  unknown";
    }
}